

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O1

void deqp::gles2::Functional::evalSequenceSideEffCase2(ShaderEvalContext *ctx)

{
  float fVar1;
  int i;
  long lVar2;
  Vector<float,_2> res;
  Vector<float,_2> res_1;
  int local_28 [2];
  Vector<int,_2> res_2;
  float afStack_10 [4];
  
  fVar1 = ctx->in[0].m_data[2];
  lVar2 = 0;
  do {
    afStack_10[lVar2 + 2] = 1.0;
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    res.m_data[lVar2] = afStack_10[lVar2 + -2] + afStack_10[lVar2 + 2];
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  lVar2 = 0;
  do {
    afStack_10[lVar2] = (float)(-(uint)(0.0 < fVar1) & 0x3f800000);
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    res_1.m_data[lVar2] = res.m_data[lVar2] + afStack_10[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  res_2.m_data[0] = 0;
  res_2.m_data[1] = 0;
  lVar2 = 0;
  do {
    res_2.m_data[lVar2] = (int)res_1.m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    res.m_data[lVar2] = (float)res_2.m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  res_1.m_data = (float  [2])&ctx->color;
  local_28[0] = 1;
  local_28[1] = 2;
  lVar2 = 0;
  do {
    (ctx->color).m_data[(&res_2)[-1].m_data[lVar2]] = res.m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  return;
}

Assistant:

void evalSequenceSideEffCase2	(ShaderEvalContext& ctx) { ctx.color.yz()	= sequenceSideEffCase2(ctx.in[0].z() > 0.0f, ctx.in[1].x() > 0.0f, ctx.in[2].swizzle(2, 1)).asFloat(); }